

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

vector<const_char_*,_std::allocator<const_char_*>_> *
Cat<std::vector<char_const*,std::allocator<char_const*>>>
          (vector<const_char_*,_std::allocator<const_char_*>_> *v1,
          vector<const_char_*,_std::allocator<const_char_*>_> *v2)

{
  long lVar1;
  bool bVar2;
  size_type in_RDX;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_RSI;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_RDI;
  long in_FS_OFFSET;
  char **arg;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range1;
  iterator __end0;
  iterator __begin0;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_ffffffffffffff98;
  vector<const_char_*,_std::allocator<const_char_*>_> *__lhs;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __lhs = in_RDI;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::size(in_stack_ffffffffffffff98);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::size(in_stack_ffffffffffffff98);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve(in_RSI,in_RDX);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::begin(in_RDI);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::end(in_RDI);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                      ((__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                        *)__lhs,(__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                 *)in_RDI);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
    operator*((__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
               *)in_stack_ffffffffffffff98);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              (in_stack_ffffffffffffff98,(value_type *)0xeaf092);
    __gnu_cxx::
    __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
    operator++((__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                *)in_stack_ffffffffffffff98);
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (in_stack_ffffffffffffff98,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)0xeaf0ad);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __lhs;
  }
  __stack_chk_fail();
}

Assistant:

inline V Cat(V v1, V&& v2)
{
    v1.reserve(v1.size() + v2.size());
    for (auto& arg : v2) {
        v1.push_back(std::move(arg));
    }
    return v1;
}